

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

uint32_t helper_sigp(CPUS390XState_conflict *env,uint64_t order_code,uint32_t r1,uint32_t r3)

{
  uint32_t r3_local;
  uint32_t r1_local;
  uint64_t order_code_local;
  CPUS390XState_conflict *env_local;
  
  return 0;
}

Assistant:

uint32_t HELPER(sigp)(CPUS390XState *env, uint64_t order_code, uint32_t r1,
                      uint32_t r3)
{
#if 0
    int cc;

    /* TODO: needed to inject interrupts  - push further down */
    qemu_mutex_lock_iothread();
    cc = handle_sigp(env, order_code & SIGP_ORDER_MASK, r1, r3);
    qemu_mutex_unlock_iothread();

    return cc;
#endif
    return 0;
}